

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_model.c
# Opt level: O3

int32 ngram_model_read_classdef(ngram_model_t *model,char *file_name)

{
  gnode_s **ppgVar1;
  undefined8 *puVar2;
  glist_t pgVar3;
  int32 iVar4;
  hash_table_t *classes;
  glist_t g;
  int32 iVar5;
  gnode_s *pgVar6;
  
  iVar5 = 0;
  classes = hash_table_new(0,0);
  iVar4 = read_classdef_file(classes,file_name);
  if (iVar4 < 0) {
    iVar5 = -1;
  }
  else {
    g = hash_table_tolist(classes,(int32 *)0x0);
    pgVar6 = g;
    if (g != (glist_t)0x0) {
      do {
        puVar2 = *(undefined8 **)((long)(pgVar6->data).ptr + 0x10);
        iVar4 = ngram_model_add_class
                          (model,*(pgVar6->data).ptr,1.0,(char **)*puVar2,(float32 *)puVar2[1],
                           *(int32 *)(puVar2 + 2));
        pgVar3 = g;
        if (iVar4 < 0) {
          iVar5 = -1;
          goto joined_r0x00132ba4;
        }
        ppgVar1 = &pgVar6->next;
        pgVar6 = *ppgVar1;
      } while (*ppgVar1 != (gnode_s *)0x0);
      iVar5 = 0;
joined_r0x00132ba4:
      for (; pgVar3 != (glist_t)0x0; pgVar3 = pgVar3->next) {
        puVar2 = (undefined8 *)(pgVar3->data).ptr;
        ckd_free((void *)*puVar2);
        classdef_free((classdef_t *)puVar2[2]);
      }
    }
    glist_free(g);
  }
  hash_table_free(classes);
  return iVar5;
}

Assistant:

int32
ngram_model_read_classdef(ngram_model_t * model, const char *file_name)
{
    hash_table_t *classes;
    glist_t hl = NULL;
    gnode_t *gn;
    int32 rv = -1;

    classes = hash_table_new(0, FALSE);
    if (read_classdef_file(classes, file_name) < 0) {
        hash_table_free(classes);
        return -1;
    }

    /* Create a new class in the language model for each classdef. */
    hl = hash_table_tolist(classes, NULL);
    for (gn = hl; gn; gn = gnode_next(gn)) {
        hash_entry_t *he = gnode_ptr(gn);
        classdef_t *classdef = he->val;

        if (ngram_model_add_class(model, he->key, 1.0,
                                  classdef->words,
                                  classdef->weights,
                                  classdef->n_words) < 0)
            goto error_out;
    }
    rv = 0;

  error_out:
    for (gn = hl; gn; gn = gnode_next(gn)) {
        hash_entry_t *he = gnode_ptr(gn);
        ckd_free((char *) he->key);
        classdef_free(he->val);
    }
    glist_free(hl);
    hash_table_free(classes);
    return rv;
}